

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImPool<ImGuiTabBar>::~ImPool(ImPool<ImGuiTabBar> *this)

{
  int *piVar1;
  ImGuiStoragePair *pIVar2;
  ImGuiTabBar *pIVar3;
  
  Clear(this);
  pIVar2 = (this->Map).Data.Data;
  if (pIVar2 != (ImGuiStoragePair *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
  }
  pIVar3 = (this->Buf).Data;
  if (pIVar3 != (ImGuiTabBar *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
  }
  return;
}

Assistant:

~ImPool()   { Clear(); }